

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

void __thiscall
QHeaderViewPrivate::sectionsMoved
          (QHeaderViewPrivate *this,QModelIndex *sourceParent,int logicalStart,int logicalEnd,
          QModelIndex *destinationParent,int logicalDestination)

{
  QPersistentModelIndex *pQVar1;
  char cVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QPersistentModelIndex> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &(this->super_QAbstractItemViewPrivate).root;
  cVar2 = comparesEqual(pQVar1,sourceParent);
  if (cVar2 != '\0') {
    cVar2 = comparesEqual(pQVar1,destinationParent);
    if (cVar2 != '\0') {
      local_38.d = (Data *)0x0;
      local_38.ptr = (QPersistentModelIndex *)0x0;
      local_38.size = 0;
      sectionsChanged(this,(QList<QPersistentModelIndex> *)destinationParent,NoLayoutChangeHint);
      QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHeaderViewPrivate::sectionsMoved(const QModelIndex &sourceParent, int logicalStart,
                                       int logicalEnd, const QModelIndex &destinationParent,
                                       int logicalDestination)
{
    if (sourceParent != root || destinationParent != root)
        return; // we only handle changes in the root level
    Q_UNUSED(logicalStart);
    Q_UNUSED(logicalEnd);
    Q_UNUSED(logicalDestination);
    sectionsChanged();
}